

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

void __thiscall
Assimp::BVHLoader::InternReadFile
          (BVHLoader *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> this_00;
  int iVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  reference pvVar4;
  undefined1 local_140 [8];
  SkeletonMeshBuilder meshBuilder;
  char *local_e8;
  undefined1 local_da;
  allocator<char> local_d9;
  string local_d8;
  size_type local_b8;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  BVHLoader *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::__cxx11::string::operator=((string *)&this->mFileName,(string *)pFile);
  this_00._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>.
       _M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
       super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open((IOSystem *)
                       this_00._M_t.
                       super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                       .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl,pFile,
                       &local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    fileSize._7_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_88);
    fileSize._7_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  iVar1 = (*pIVar2->_vptr_IOStream[6])();
  local_b8 = CONCAT44(extraout_var,iVar1);
  if (local_b8 == 0) {
    local_da = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"File is too small.",&local_d9);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_d8);
    local_da = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->mBuffer,local_b8);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  pvVar4 = std::vector<char,_std::allocator<char>_>::front(&this->mBuffer);
  (*pIVar2->_vptr_IOStream[2])(pIVar2,pvVar4,1);
  meshBuilder._72_8_ = std::vector<char,_std::allocator<char>_>::begin(&this->mBuffer);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_e8,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
             &meshBuilder.mKnobsOnly);
  (this->mReader)._M_current = local_e8;
  this->mLine = 1;
  ReadStructure(this,pScene);
  if ((this->noSkeletonMesh & 1U) == 0) {
    SkeletonMeshBuilder::SkeletonMeshBuilder
              ((SkeletonMeshBuilder *)local_140,pScene,(aiNode *)0x0,false);
    SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_140);
  }
  CreateAnimation(this,pScene);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void BVHLoader::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler)
{
    mFileName = pFile;

    // read file into memory
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open file " + pFile + ".");

    size_t fileSize = file->FileSize();
    if( fileSize == 0)
        throw DeadlyImportError( "File is too small.");

    mBuffer.resize( fileSize);
    file->Read( &mBuffer.front(), 1, fileSize);

    // start reading
    mReader = mBuffer.begin();
    mLine = 1;
    ReadStructure( pScene);

    if (!noSkeletonMesh) {
        // build a dummy mesh for the skeleton so that we see something at least
        SkeletonMeshBuilder meshBuilder( pScene);
    }

    // construct an animation from all the motion data we read
    CreateAnimation( pScene);
}